

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void updateAccumulator(Parse *pParse,int regAcc,AggInfo *pAggInfo,int eDistinctType)

{
  Vdbe *p;
  ExprList *pList_00;
  Expr *pExpr;
  int iVar1;
  int local_84;
  ExprList_item *pEStack_80;
  int j;
  ExprList_item *pItem;
  CollSeq *pColl;
  Expr *pFilter;
  ExprList *pList;
  int local_58;
  int regAgg;
  int addrNext;
  int nArg;
  AggInfo_col *pC;
  AggInfo_func *pF;
  int local_38;
  int addrHitTest;
  int regHit;
  int i;
  Vdbe *v;
  int eDistinctType_local;
  AggInfo *pAggInfo_local;
  int regAcc_local;
  Parse *pParse_local;
  
  p = pParse->pVdbe;
  local_38 = 0;
  pF._4_4_ = 0;
  pAggInfo->directMode = '\x01';
  addrHitTest = 0;
  pC = (AggInfo_col *)pAggInfo->aFunc;
  for (; addrHitTest < pAggInfo->nFunc; addrHitTest = addrHitTest + 1) {
    local_58 = 0;
    pList_00 = pC->pTab->pCheck;
    if (((ulong)pC->pTab->zName & 0x100000000000000) != 0) {
      pExpr = (Expr *)((pC->pTab->u).view.pSelect)->pOrderBy;
      if (((pAggInfo->nAccumulator != 0) && ((pC->pCExpr->flags & 0x20) != 0)) && (regAcc != 0)) {
        if (local_38 == 0) {
          local_38 = pParse->nMem + 1;
          pParse->nMem = local_38;
        }
        sqlite3VdbeAddOp2(p,0x50,regAcc,local_38);
      }
      local_58 = sqlite3VdbeMakeLabel(pParse);
      sqlite3ExprIfFalse(pParse,pExpr,local_58,0x10);
    }
    if (pList_00 == (ExprList *)0x0) {
      regAgg = 0;
      pList._4_4_ = 0;
    }
    else {
      regAgg = pList_00->nExpr;
      pList._4_4_ = sqlite3GetTempRange(pParse,regAgg);
      sqlite3ExprCodeExprList(pParse,pList_00,pList._4_4_,0,'\x01');
    }
    if ((-1 < pC->iMem) && (pList_00 != (ExprList *)0x0)) {
      if (local_58 == 0) {
        local_58 = sqlite3VdbeMakeLabel(pParse);
      }
      iVar1 = codeDistinct(pParse,eDistinctType,pC->iMem,local_58,pList_00,pList._4_4_);
      pC->iMem = iVar1;
    }
    if ((pC->pCExpr->flags & 0x20) != 0) {
      pItem = (ExprList_item *)0x0;
      pEStack_80 = pList_00->a;
      for (local_84 = 0; pItem == (ExprList_item *)0x0 && local_84 < regAgg; local_84 = local_84 + 1
          ) {
        pItem = (ExprList_item *)sqlite3ExprCollSeq(pParse,pEStack_80->pExpr);
        pEStack_80 = pEStack_80 + 1;
      }
      if (pItem == (ExprList_item *)0x0) {
        pItem = (ExprList_item *)pParse->db->pDfltColl;
      }
      if ((local_38 == 0) && (pAggInfo->nAccumulator != 0)) {
        local_38 = pParse->nMem + 1;
        pParse->nMem = local_38;
      }
      sqlite3VdbeAddOp4(p,0x55,local_38,0,0,(char *)pItem,-2);
    }
    sqlite3VdbeAddOp3(p,0xa2,0,pList._4_4_,pC->iTable);
    sqlite3VdbeAppendP4(p,pC->pCExpr,-7);
    sqlite3VdbeChangeP5(p,(ushort)regAgg & 0xff);
    sqlite3ReleaseTempRange(pParse,pList._4_4_,regAgg);
    if (local_58 != 0) {
      sqlite3VdbeResolveLabel(p,local_58);
    }
    pC = pC + 1;
  }
  if ((local_38 == 0) && (pAggInfo->nAccumulator != 0)) {
    local_38 = regAcc;
  }
  if (local_38 != 0) {
    pF._4_4_ = sqlite3VdbeAddOp1(p,0xf,local_38);
  }
  addrHitTest = 0;
  _addrNext = pAggInfo->aCol;
  for (; addrHitTest < pAggInfo->nAccumulator; addrHitTest = addrHitTest + 1) {
    sqlite3ExprCode(pParse,_addrNext->pCExpr,_addrNext->iMem);
    _addrNext = _addrNext + 1;
  }
  pAggInfo->directMode = '\0';
  if (pF._4_4_ != 0) {
    sqlite3VdbeJumpHereOrPopInst(p,pF._4_4_);
  }
  return;
}

Assistant:

static void updateAccumulator(
  Parse *pParse,
  int regAcc,
  AggInfo *pAggInfo,
  int eDistinctType
){
  Vdbe *v = pParse->pVdbe;
  int i;
  int regHit = 0;
  int addrHitTest = 0;
  struct AggInfo_func *pF;
  struct AggInfo_col *pC;

  pAggInfo->directMode = 1;
  for(i=0, pF=pAggInfo->aFunc; i<pAggInfo->nFunc; i++, pF++){
    int nArg;
    int addrNext = 0;
    int regAgg;
    ExprList *pList;
    assert( ExprUseXList(pF->pFExpr) );
    assert( !IsWindowFunc(pF->pFExpr) );
    pList = pF->pFExpr->x.pList;
    if( ExprHasProperty(pF->pFExpr, EP_WinFunc) ){
      Expr *pFilter = pF->pFExpr->y.pWin->pFilter;
      if( pAggInfo->nAccumulator
       && (pF->pFunc->funcFlags & SQLITE_FUNC_NEEDCOLL)
       && regAcc
      ){
        /* If regAcc==0, there there exists some min() or max() function
        ** without a FILTER clause that will ensure the magnet registers
        ** are populated. */
        if( regHit==0 ) regHit = ++pParse->nMem;
        /* If this is the first row of the group (regAcc contains 0), clear the
        ** "magnet" register regHit so that the accumulator registers
        ** are populated if the FILTER clause jumps over the the
        ** invocation of min() or max() altogether. Or, if this is not
        ** the first row (regAcc contains 1), set the magnet register so that
        ** the accumulators are not populated unless the min()/max() is invoked
        ** and indicates that they should be.  */
        sqlite3VdbeAddOp2(v, OP_Copy, regAcc, regHit);
      }
      addrNext = sqlite3VdbeMakeLabel(pParse);
      sqlite3ExprIfFalse(pParse, pFilter, addrNext, SQLITE_JUMPIFNULL);
    }
    if( pList ){
      nArg = pList->nExpr;
      regAgg = sqlite3GetTempRange(pParse, nArg);
      sqlite3ExprCodeExprList(pParse, pList, regAgg, 0, SQLITE_ECEL_DUP);
    }else{
      nArg = 0;
      regAgg = 0;
    }
    if( pF->iDistinct>=0 && pList ){
      if( addrNext==0 ){
        addrNext = sqlite3VdbeMakeLabel(pParse);
      }
      pF->iDistinct = codeDistinct(pParse, eDistinctType,
          pF->iDistinct, addrNext, pList, regAgg);
    }
    if( pF->pFunc->funcFlags & SQLITE_FUNC_NEEDCOLL ){
      CollSeq *pColl = 0;
      struct ExprList_item *pItem;
      int j;
      assert( pList!=0 );  /* pList!=0 if pF->pFunc has NEEDCOLL */
      for(j=0, pItem=pList->a; !pColl && j<nArg; j++, pItem++){
        pColl = sqlite3ExprCollSeq(pParse, pItem->pExpr);
      }
      if( !pColl ){
        pColl = pParse->db->pDfltColl;
      }
      if( regHit==0 && pAggInfo->nAccumulator ) regHit = ++pParse->nMem;
      sqlite3VdbeAddOp4(v, OP_CollSeq, regHit, 0, 0, (char *)pColl, P4_COLLSEQ);
    }
    sqlite3VdbeAddOp3(v, OP_AggStep, 0, regAgg, pF->iMem);
    sqlite3VdbeAppendP4(v, pF->pFunc, P4_FUNCDEF);
    sqlite3VdbeChangeP5(v, (u8)nArg);
    sqlite3ReleaseTempRange(pParse, regAgg, nArg);
    if( addrNext ){
      sqlite3VdbeResolveLabel(v, addrNext);
    }
  }
  if( regHit==0 && pAggInfo->nAccumulator ){
    regHit = regAcc;
  }
  if( regHit ){
    addrHitTest = sqlite3VdbeAddOp1(v, OP_If, regHit); VdbeCoverage(v);
  }
  for(i=0, pC=pAggInfo->aCol; i<pAggInfo->nAccumulator; i++, pC++){
    sqlite3ExprCode(pParse, pC->pCExpr, pC->iMem);
  }

  pAggInfo->directMode = 0;
  if( addrHitTest ){
    sqlite3VdbeJumpHereOrPopInst(v, addrHitTest);
  }
}